

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::read_in_particle_samples_mixed_event_and_filter(particleSamples *this)

{
  particleSamples *in_RDI;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000058;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000060;
  int in_stack_0000006c;
  particleSamples *in_stack_00000070;
  
  if ((in_RDI->read_mixed_events & 1U) == 0) {
    in_RDI->full_particle_list_mixed_event = in_RDI->full_particle_list;
    in_RDI->particle_list_mixed_event = in_RDI->particle_list;
  }
  else {
    read_in_particle_samples_mixed_event(in_RDI);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  }
  if ((in_RDI->analyze_BF & 1U) != 0) {
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

void particleSamples::read_in_particle_samples_mixed_event_and_filter() {
    if (!read_mixed_events) {
        full_particle_list_mixed_event = full_particle_list;
        particle_list_mixed_event = particle_list;
    } else {
        read_in_particle_samples_mixed_event();

        filter_particles(
            particle_monval, full_particle_list_mixed_event,
            particle_list_mixed_event);
    }
    if (analyze_BF) {
        filter_particles(
            particle_monval_a, full_particle_list_mixed_event,
            balance_function_particle_a_mixed_event);
        filter_particles(
            particle_monval_abar, full_particle_list_mixed_event,
            balance_function_particle_abar_mixed_event);
        filter_particles(
            particle_monval_b, full_particle_list_mixed_event,
            balance_function_particle_b_mixed_event);
        filter_particles(
            particle_monval_bbar, full_particle_list_mixed_event,
            balance_function_particle_bbar_mixed_event);
    }
}